

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::unitPropagate(Solver *this)

{
  bool bVar1;
  size_type sVar2;
  Solver *pSVar3;
  reference pGVar4;
  long in_RDI;
  GenericWatch *w_1;
  PropResult res_1;
  right_iterator j_1;
  right_iterator end_1;
  right_iterator it_1;
  ClauseWatch *w;
  PropResult res;
  left_iterator j;
  left_iterator end;
  left_iterator it;
  WatchList *wl;
  uint32 maxIdx;
  ShortImplicationsGraph *btig;
  uint32 DL;
  uint32 ignore;
  uint32 idx;
  Literal r;
  Literal q;
  Literal p;
  Assignment *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int iVar5;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *in_stack_fffffffffffffee8;
  Solver *in_stack_fffffffffffffef0;
  Solver *in_stack_fffffffffffffef8;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *in_stack_ffffffffffffff00;
  reverse_iterator<Clasp::GenericWatch_*> local_f0;
  reverse_iterator<Clasp::GenericWatch_*> in_stack_ffffffffffffff18;
  reverse_iterator<Clasp::GenericWatch_*> in_stack_ffffffffffffff20;
  reverse_iterator<Clasp::GenericWatch_*> in_stack_ffffffffffffff28;
  reverse_iterator<Clasp::GenericWatch_*> local_c8;
  uint32 local_c0;
  PropResult local_ba;
  reverse_iterator<Clasp::GenericWatch_*> in_stack_ffffffffffffff48;
  Solver *in_stack_ffffffffffffff50;
  ClauseHead *in_stack_ffffffffffffff58;
  Literal in_stack_ffffffffffffff60;
  PropResult local_92;
  reverse_iterator<Clasp::GenericWatch_*> local_90;
  reverse_iterator<Clasp::GenericWatch_*> local_88;
  reverse_iterator<Clasp::GenericWatch_*> local_80;
  uint32 local_78;
  PropResult local_72;
  left_iterator local_70;
  PropResult local_62;
  left_iterator local_60;
  left_iterator local_58;
  left_iterator local_50;
  uint32 local_44;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *local_40;
  uint32 local_38;
  uint32 local_34;
  ImpGraphRef local_30;
  uint32 local_28;
  uint local_20;
  Literal local_1c;
  Literal local_18;
  Literal local_14 [5];
  
  Literal::Literal(local_14);
  Literal::Literal(&local_18);
  Literal::Literal(&local_1c);
  local_28 = decisionLevel((Solver *)0x1ea45d);
  local_30 = SharedContext::shortImplications(*(SharedContext **)(in_RDI + 0x68));
  local_34 = ShortImplicationsGraph::size((ShortImplicationsGraph *)0x1ea489);
  do {
    do {
      bVar1 = Assignment::qEmpty((Assignment *)
                                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        iVar5 = CONCAT13(1,(int3)in_stack_fffffffffffffee4);
        if (local_28 == 0) {
          bVar1 = Assignment::markUnits((Assignment *)CONCAT44(iVar5,in_stack_fffffffffffffee0));
          iVar5 = (uint)bVar1 << 0x18;
        }
        return SUB41((uint)iVar5 >> 0x18,0);
      }
      local_38 = (uint32)Assignment::qPop(in_stack_fffffffffffffed8);
      local_14[0] = (Literal)local_38;
      local_20 = Literal::id(local_14);
      local_40 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                 bk_lib::
                 pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                 ::operator[]((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                               *)(in_RDI + 0x170),local_20);
      if (local_20 < local_34) {
        local_44 = local_14[0].rep_;
        bVar1 = ShortImplicationsGraph::propagate
                          ((ShortImplicationsGraph *)in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef0,
                           (Literal)(uint32)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        if (!bVar1) {
          return false;
        }
      }
      sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_size
                        (local_40);
      if (sVar2 != 0) {
        local_60 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::
                   left_begin((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1ea571);
        Constraint::PropResult::PropResult(&local_62,true,true);
        local_50 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::
                   left_begin((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1ea59a);
        local_58 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_end
                             (local_40);
        while (local_50 != local_58) {
          local_70 = local_50;
          local_78 = local_14[0].rep_;
          local_50 = local_50 + 1;
          local_72 = ClauseHead::propagate
                               (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                in_stack_ffffffffffffff60,
                                (uint32 *)in_stack_ffffffffffffff48.current);
          if (((ushort)local_72 & 0x100) != 0) {
            local_60->head = local_70->head;
            local_60 = local_60 + 1;
          }
          local_62 = local_72;
          if (((ushort)local_72 & 1) == 0) {
            std::copy<Clasp::ClauseWatch*,Clasp::ClauseWatch*>
                      ((ClauseWatch *)in_stack_fffffffffffffef0,
                       (ClauseWatch *)in_stack_fffffffffffffee8,
                       (ClauseWatch *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
            ;
            bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::shrink_left
                      ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                       in_stack_fffffffffffffef0,(left_iterator)in_stack_fffffffffffffee8);
            return false;
          }
        }
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::shrink_left
                  ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
                   in_stack_fffffffffffffef0,(left_iterator)in_stack_fffffffffffffee8);
      }
      sVar2 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_size
                        (local_40);
    } while (sVar2 == 0);
    std::reverse_iterator<Clasp::GenericWatch_*>::reverse_iterator(&local_80);
    std::reverse_iterator<Clasp::GenericWatch_*>::reverse_iterator(&local_88);
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_begin
              (in_stack_fffffffffffffee8);
    Constraint::PropResult::PropResult(&local_92,true,true);
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_begin
              (in_stack_fffffffffffffee8);
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::right_end
              ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)in_stack_fffffffffffffed8)
    ;
    while (bVar1 = std::operator!=((reverse_iterator<Clasp::GenericWatch_*> *)
                                   CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                                   (reverse_iterator<Clasp::GenericWatch_*> *)
                                   in_stack_fffffffffffffed8), bVar1) {
      std::reverse_iterator<Clasp::GenericWatch_*>::operator++
                ((reverse_iterator<Clasp::GenericWatch_*> *)in_stack_fffffffffffffee8,
                 in_stack_fffffffffffffee4);
      pSVar3 = (Solver *)
               std::reverse_iterator<Clasp::GenericWatch_*>::operator*
                         ((reverse_iterator<Clasp::GenericWatch_*> *)&stack0xffffffffffffff48);
      local_c0 = local_14[0].rep_;
      local_ba = GenericWatch::propagate
                           ((GenericWatch *)in_stack_fffffffffffffee8,
                            (Solver *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            (Literal)(uint32)in_stack_fffffffffffffef0);
      in_stack_ffffffffffffff50 = pSVar3;
      local_92 = local_ba;
      if (((ushort)local_ba & 0x100) != 0) {
        std::reverse_iterator<Clasp::GenericWatch_*>::operator++
                  ((reverse_iterator<Clasp::GenericWatch_*> *)in_stack_fffffffffffffee8,
                   in_stack_fffffffffffffee4);
        pGVar4 = std::reverse_iterator<Clasp::GenericWatch_*>::operator*(&local_c8);
        pGVar4->con = *(Constraint **)pSVar3;
        pGVar4->data = *(uint32 *)&(pSVar3->model).ebo_.buf;
        in_stack_fffffffffffffef8 = pSVar3;
      }
      if (((ushort)local_92 & 1) == 0) {
        std::reverse_iterator<Clasp::GenericWatch_*>::reverse_iterator
                  ((reverse_iterator<Clasp::GenericWatch_*> *)&stack0xffffffffffffff28,&local_80);
        std::reverse_iterator<Clasp::GenericWatch_*>::reverse_iterator
                  ((reverse_iterator<Clasp::GenericWatch_*> *)&stack0xffffffffffffff20,&local_88);
        std::reverse_iterator<Clasp::GenericWatch_*>::reverse_iterator
                  ((reverse_iterator<Clasp::GenericWatch_*> *)&stack0xffffffffffffff18,&local_90);
        std::
        copy<std::reverse_iterator<Clasp::GenericWatch*>,std::reverse_iterator<Clasp::GenericWatch*>>
                  ((reverse_iterator<Clasp::GenericWatch_*> *)in_stack_ffffffffffffff28.current,
                   (reverse_iterator<Clasp::GenericWatch_*> *)in_stack_ffffffffffffff20.current,
                   (reverse_iterator<Clasp::GenericWatch_*> *)in_stack_ffffffffffffff18.current);
        bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::shrink_right
                  (in_stack_ffffffffffffff00,(right_iterator *)in_stack_fffffffffffffef8);
        return false;
      }
    }
    in_stack_fffffffffffffee8 = local_40;
    std::reverse_iterator<Clasp::GenericWatch_*>::reverse_iterator(&local_f0,&local_90);
    bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::shrink_right
              (in_stack_ffffffffffffff00,(right_iterator *)in_stack_fffffffffffffef8);
  } while( true );
}

Assistant:

bool Solver::unitPropagate() {
	assert(!hasConflict());
	Literal p, q, r;
	uint32 idx, ignore, DL = decisionLevel();
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	while ( !assign_.qEmpty() ) {
		p             = assign_.qPop();
		idx           = p.id();
		WatchList& wl = watches_[idx];
		// first: short clause BCP
		if (idx < maxIdx && !btig.propagate(*this, p)) {
			return false;
		}
		// second: clause BCP
		if (wl.left_size() != 0) {
			WatchList::left_iterator it, end, j = wl.left_begin();
			Constraint::PropResult res;
			for (it = wl.left_begin(), end = wl.left_end();  it != end;  ) {
				ClauseWatch& w = *it++;
				res = w.head->ClauseHead::propagate(*this, p, ignore);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_left(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_left(j);
		}
		// third: general constraint BCP
		if (wl.right_size() != 0) {
			WatchList::right_iterator it, end, j = wl.right_begin();
			Constraint::PropResult res;
			for (it = wl.right_begin(), end = wl.right_end(); it != end; ) {
				GenericWatch& w = *it++;
				res = w.propagate(*this, p);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_right(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_right(j);
		}
	}
	return DL || assign_.markUnits();
}